

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWatermarkLabel::setSideWidget(QWatermarkLabel *this,QWidget *widget)

{
  QWidget *widget_00;
  
  widget_00 = this->m_sideWidget;
  if (widget_00 != widget) {
    if (widget_00 != (QWidget *)0x0) {
      QLayout::removeWidget((QLayout *)this->m_layout,widget_00);
      QWidget::hide(this->m_sideWidget);
    }
    this->m_sideWidget = widget;
    if (widget != (QWidget *)0x0) {
      QBoxLayout::addWidget(&this->m_layout->super_QBoxLayout,widget,0,(Alignment)0x0);
      return;
    }
  }
  return;
}

Assistant:

void setSideWidget(QWidget *widget) {
        if (m_sideWidget == widget)
            return;
        if (m_sideWidget) {
            m_layout->removeWidget(m_sideWidget);
            m_sideWidget->hide();
        }
        m_sideWidget = widget;
        if (m_sideWidget)
            m_layout->addWidget(m_sideWidget);
    }